

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O1

asn_enc_rval_t *
OCTET_STRING_encode_xer_utf8
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,int ilevel,
          xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  size_t sVar8;
  long local_68;
  
  if ((sptr == (void *)0x0) ||
     ((pbVar5 = *sptr, pbVar5 == (byte *)0x0 && (*(int *)((long)sptr + 8) != 0)))) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
  }
  else {
    pbVar7 = pbVar5;
    if ((long)*(int *)((long)sptr + 8) < 1) {
      local_68 = 0;
    }
    else {
      pbVar4 = pbVar5 + *(int *)((long)sptr + 8);
      local_68 = 0;
      pbVar6 = pbVar5;
      do {
        bVar1 = *pbVar7;
        bVar2 = true;
        if (bVar1 < 0x3f) {
          sVar8 = (size_t)OCTET_STRING__xer_escape_table[bVar1].size;
          if (sVar8 != 0) {
            if (((pbVar7 == pbVar5) ||
                (iVar3 = (*cb)(pbVar5,(long)pbVar6 - (long)pbVar5,app_key), -1 < iVar3)) &&
               (iVar3 = (*cb)(OCTET_STRING__xer_escape_table[bVar1].string,sVar8,app_key),
               -1 < iVar3)) {
              local_68 = local_68 + sVar8 + ((long)pbVar6 - (long)pbVar5);
              pbVar5 = pbVar7 + 1;
            }
            else {
              __return_storage_ptr__->encoded = -1;
              __return_storage_ptr__->failed_type = td;
              __return_storage_ptr__->structure_ptr = sptr;
              bVar2 = false;
            }
          }
        }
        if (!bVar2) {
          return __return_storage_ptr__;
        }
        pbVar7 = pbVar7 + 1;
        pbVar6 = pbVar6 + 1;
      } while (pbVar7 < pbVar4);
    }
    sVar8 = (long)pbVar7 - (long)pbVar5;
    if ((sVar8 == 0) || (iVar3 = (*cb)(pbVar5,sVar8,app_key), -1 < iVar3)) {
      __return_storage_ptr__->encoded = local_68 + sVar8;
      __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
      __return_storage_ptr__->structure_ptr = (void *)0x0;
    }
    else {
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
      __return_storage_ptr__->structure_ptr = sptr;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_xer_utf8(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	asn_enc_rval_t er;
	uint8_t *buf, *end;
	uint8_t *ss;	/* Sequence start */
	ssize_t encoded_len = 0;

	(void)ilevel;	/* Unused argument */
	(void)flags;	/* Unused argument */

	if(!st || (!st->buf && st->size))
		ASN__ENCODE_FAILED;

	buf = st->buf;
	end = buf + st->size;
	for(ss = buf; buf < end; buf++) {
		unsigned int ch = *buf;
		int s_len;	/* Special encoding sequence length */

		/*
		 * Escape certain characters: X.680/11.15
		 */
		if(ch < sizeof(OCTET_STRING__xer_escape_table)
			/sizeof(OCTET_STRING__xer_escape_table[0])
		&& (s_len = OCTET_STRING__xer_escape_table[ch].size)) {
			if(((buf - ss) && cb(ss, buf - ss, app_key) < 0)
			|| cb(OCTET_STRING__xer_escape_table[ch].string, s_len,
					app_key) < 0)
				ASN__ENCODE_FAILED;
			encoded_len += (buf - ss) + s_len;
			ss = buf + 1;
		}
	}

	encoded_len += (buf - ss);
	if((buf - ss) && cb(ss, buf - ss, app_key) < 0)
		ASN__ENCODE_FAILED;

	er.encoded = encoded_len;
	ASN__ENCODED_OK(er);
}